

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort_mkq.cpp
# Opt level: O3

TSTNode<unsigned_short> * __thiscall
BurstRecursive<unsigned_short>::operator()
          (BurstRecursive<unsigned_short> *this,
          vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket,unsigned_short *oracle,
          size_t depth)

{
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket_00;
  pointer ppuVar1;
  uchar *puVar2;
  ostream *poVar3;
  ulong uVar4;
  TSTNode<unsigned_short> *pTVar5;
  TSTNode<unsigned_short> *pTVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  unsigned_short uVar10;
  ulong uVar11;
  ulong uVar12;
  DI __d;
  BurstSimple<unsigned_short> local_61;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *local_60;
  TSTNode<unsigned_short> *local_58;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *local_50;
  BurstRecursive<unsigned_short> *local_48;
  long local_40;
  DI local_38;
  
  local_48 = this;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"BurstRecursive() bucket.size()=",0x1f);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," depth=",7);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  local_38.i = &__debug_indent_str_abi_cxx11_;
  std::__cxx11::string::append((char *)&__debug_indent_str_abi_cxx11_);
  local_58 = BurstSimple<unsigned_short>::operator()(&local_61,bucket,oracle,depth);
  bucket_00 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
              (local_58->buckets)._M_elems[0];
  local_60 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
             (local_58->buckets)._M_elems[1];
  local_50 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
             (local_58->buckets)._M_elems[2];
  uVar7 = (long)(bucket->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(bucket->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                _M_impl.super__Vector_impl_data._M_start >> 3;
  uVar11 = (long)(bucket_00->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(bucket_00->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                 _M_impl.super__Vector_impl_data._M_start >> 3;
  uVar4 = (long)(local_60->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(local_60->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                _M_impl.super__Vector_impl_data._M_start >> 3;
  local_40 = uVar4 + uVar11;
  if (((long)(local_50->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(local_50->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
             _M_impl.super__Vector_impl_data._M_start >> 3) + local_40 != uVar7) {
    __assert_fail("bucket0->size() + bucket1->size() + bucket2->size() == bucket.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort_mkq.cpp"
                  ,0x6c,
                  "TSTNode<CharT> *BurstRecursive<unsigned short>::operator()(const BucketT &, CharT *, size_t) const [CharT = unsigned short, BucketT = std::vector<unsigned char *>]"
                 );
  }
  uVar7 = (ulong)((float)uVar7 * 0.7);
  uVar12 = 100;
  if (100 < (uint)uVar7) {
    uVar12 = uVar7 & 0xffffffff;
  }
  if (uVar12 < uVar11) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"BurstRecursive() bursting bucket0: size()=",0x2a);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," threshold=",0xb);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," bsize=",7);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    ppuVar1 = (bucket_00->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    lVar8 = (long)(bucket_00->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppuVar1;
    if (lVar8 != 0) {
      uVar9 = 1;
      uVar4 = 0;
      do {
        puVar2 = ppuVar1[uVar4];
        if (puVar2 == (uchar *)0x0) goto LAB_00218cce;
        if (puVar2[depth] == '\0') {
          uVar10 = 0;
        }
        else {
          uVar10 = CONCAT11(puVar2[depth],puVar2[depth + 1]);
        }
        oracle[uVar4] = uVar10;
        uVar4 = (ulong)uVar9;
        uVar9 = uVar9 + 1;
      } while (uVar4 < (ulong)(lVar8 >> 3));
    }
    pTVar5 = operator()(local_48,bucket_00,oracle,depth);
    (local_58->buckets)._M_elems[0] = pTVar5;
    ppuVar1 = (bucket_00->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if (ppuVar1 != (pointer)0x0) {
      operator_delete(ppuVar1);
    }
    operator_delete(bucket_00);
    *(byte *)&(local_58->is_tst).super__Base_bitset<1UL>._M_w =
         (byte)(local_58->is_tst).super__Base_bitset<1UL>._M_w | 1;
    uVar4 = (long)(local_60->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(local_60->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                  _M_impl.super__Vector_impl_data._M_start >> 3;
  }
  if ((uVar12 < uVar4) && ((char)local_58->pivot != '\0')) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"BurstRecursive() bursting bucket1: size()=",0x2a);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," threshold=",0xb);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," bsize=",7);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    ppuVar1 = (local_60->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    lVar8 = (long)(local_60->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)ppuVar1;
    if (lVar8 != 0) {
      uVar9 = 1;
      uVar4 = 0;
      do {
        puVar2 = ppuVar1[uVar4];
        if (puVar2 == (uchar *)0x0) goto LAB_00218cce;
        if (puVar2[depth + 2] == '\0') {
          uVar10 = 0;
        }
        else {
          uVar10 = CONCAT11(puVar2[depth + 2],puVar2[depth + 3]);
        }
        oracle[uVar11 + uVar4] = uVar10;
        uVar4 = (ulong)uVar9;
        uVar9 = uVar9 + 1;
      } while (uVar4 < (ulong)(lVar8 >> 3));
    }
    pTVar6 = operator()(local_48,local_60,oracle + uVar11,depth + 2);
    pTVar5 = local_58;
    (local_58->buckets)._M_elems[1] = pTVar6;
    ppuVar1 = (local_60->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if (ppuVar1 != (pointer)0x0) {
      operator_delete(ppuVar1);
    }
    operator_delete(local_60);
    *(byte *)&(pTVar5->is_tst).super__Base_bitset<1UL>._M_w =
         (byte)(pTVar5->is_tst).super__Base_bitset<1UL>._M_w | 2;
  }
  if (uVar12 < (ulong)((long)(local_50->
                             super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_50->
                             super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                             _M_impl.super__Vector_impl_data._M_start >> 3)) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"BurstRecursive() bursting bucket2: size()=",0x2a);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," threshold=",0xb);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," bsize=",7);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    ppuVar1 = (local_50->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    lVar8 = (long)(local_50->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)ppuVar1;
    if (lVar8 != 0) {
      uVar9 = 1;
      uVar4 = 0;
      do {
        puVar2 = ppuVar1[uVar4];
        if (puVar2 == (uchar *)0x0) {
LAB_00218cce:
          __assert_fail("ptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                        ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
        }
        if (puVar2[depth] == '\0') {
          uVar10 = 0;
        }
        else {
          uVar10 = CONCAT11(puVar2[depth],puVar2[depth + 1]);
        }
        oracle[local_40 + uVar4] = uVar10;
        uVar4 = (ulong)uVar9;
        uVar9 = uVar9 + 1;
      } while (uVar4 < (ulong)(lVar8 >> 3));
    }
    pTVar6 = operator()(local_48,local_50,oracle + local_40,depth);
    pTVar5 = local_58;
    (local_58->buckets)._M_elems[2] = pTVar6;
    ppuVar1 = (local_50->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if (ppuVar1 != (pointer)0x0) {
      operator_delete(ppuVar1);
    }
    operator_delete(local_50);
    *(byte *)&(pTVar5->is_tst).super__Base_bitset<1UL>._M_w =
         (byte)(pTVar5->is_tst).super__Base_bitset<1UL>._M_w | 4;
  }
  operator()<std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>::DI::~DI(&local_38);
  return local_58;
}

Assistant:

TSTNode<CharT>*
	operator()(const BucketT& bucket, CharT* oracle, size_t depth) const
	{
		debug() << "BurstRecursive() bucket.size()=" << bucket.size() << " depth=" << depth << "\n"; debug_indent;
		TSTNode<CharT>* new_node
			= BurstSimple<CharT>()(bucket, oracle, depth);
		BucketT* bucket0 = static_cast<BucketT*>(new_node->buckets[0]);
		BucketT* bucket1 = static_cast<BucketT*>(new_node->buckets[1]);
		BucketT* bucket2 = static_cast<BucketT*>(new_node->buckets[2]);
		const unsigned threshold = std::max(100u,
				unsigned(0.7f*bucket.size()));
		assert(bucket0->size() + bucket1->size() + bucket2->size()
				== bucket.size());
		size_t bsize = 0;
		const size_t bsize0 = bucket0->size();
		const size_t bsize1 = bucket1->size();
		if (bucket0->size() > threshold) {
			debug() << "BurstRecursive() bursting bucket0: size()=" << bucket0->size()
				<< " threshold=" << threshold << " bsize=" << bsize << "\n";
			for (unsigned i=0; i < bucket0->size(); ++i)
				oracle[bsize+i] = get_char<CharT>((*bucket0)[i], depth);
			new_node->buckets[0] = this->operator()(*bucket0,
					oracle, depth);
			delete bucket0;
			new_node->is_tst[0] = true;
		}
		bsize += bsize0;
		if (bucket1->size() > threshold and not is_end(new_node->pivot)) {
			debug() << "BurstRecursive() bursting bucket1: size()=" << bucket1->size()
				<< " threshold=" << threshold << " bsize=" << bsize << "\n";
			for (unsigned i=0; i < bucket1->size(); ++i)
				oracle[bsize+i] = get_char<CharT>((*bucket1)[i], depth+sizeof(CharT));
			new_node->buckets[1] = this->operator()(*bucket1,
					oracle+bsize, depth+sizeof(CharT));
			delete bucket1;
			new_node->is_tst[1] = true;
		}
		bsize += bsize1;
		if (bucket2->size() > threshold) {
			debug() << "BurstRecursive() bursting bucket2: size()=" << bucket2->size()
				<< " threshold=" << threshold << " bsize=" << bsize << "\n";
			for (unsigned i=0; i < bucket2->size(); ++i)
				oracle[bsize+i] = get_char<CharT>((*bucket2)[i], depth);
			new_node->buckets[2] = this->operator()(*bucket2,
					oracle+bsize, depth);
			delete bucket2;
			new_node->is_tst[2] = true;
		}
		return new_node;
	}